

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::IO_Action_PDU::operator==(IO_Action_PDU *this,IO_Action_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = IO_Header::operator!=(&this->super_IO_Header,&Value->super_IO_Header);
  if ((((((!KVar1) &&
         (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                            (&this->m_RecEntityID,&Value->m_RecEntityID), !KVar1)) &&
        (this->m_ui32ReqId == Value->m_ui32ReqId)) &&
       ((this->m_ui16WrTyp == Value->m_ui16WrTyp && (this->m_ui16SimSrc == Value->m_ui16SimSrc))))
      && ((this->m_ui16ActTyp == Value->m_ui16ActTyp &&
          ((this->m_ui16ActPhs == Value->m_ui16ActPhs &&
           (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                              (&this->m_AtkEntityID,&Value->m_AtkEntityID), !KVar1)))))) &&
     (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_TgtEntityID,&Value->m_TgtEntityID),
     !KVar1)) {
    return this->m_ui16NumStdVarRec == Value->m_ui16NumStdVarRec;
  }
  return false;
}

Assistant:

KBOOL IO_Action_PDU::operator == ( const IO_Action_PDU & Value ) const
{
    if( IO_Header::operator !=( Value ) )                 return false;
    if( m_RecEntityID       != Value.m_RecEntityID )      return false;
    if( m_ui32ReqId         != Value.m_ui32ReqId )        return false;
    if( m_ui16WrTyp         != Value.m_ui16WrTyp )        return false;
    if( m_ui16SimSrc        != Value.m_ui16SimSrc )       return false;
    if( m_ui16ActTyp        != Value.m_ui16ActTyp )       return false;
    if( m_ui16ActPhs        != Value.m_ui16ActPhs )       return false;
    if( m_AtkEntityID       != Value.m_AtkEntityID )      return false;
    if( m_TgtEntityID       != Value.m_TgtEntityID )      return false;
    if( m_ui16NumStdVarRec  != Value.m_ui16NumStdVarRec ) return false;
    return true;
}